

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbisetb.cpp
# Opt level: O0

void __thiscall icu_63::RBBISetBuilder::mergeCategories(RBBISetBuilder *this,IntPair categories)

{
  uint uVar1;
  int32_t rangeDict;
  int32_t rangeNum;
  RangeDescriptor *rd;
  RBBISetBuilder *this_local;
  IntPair categories_local;
  
  for (_rangeDict = this->fRangeList; _rangeDict != (RangeDescriptor *)0x0;
      _rangeDict = _rangeDict->fNext) {
    uVar1 = _rangeDict->fNum & 0xffffbfff;
    this_local._4_4_ = categories.second;
    if (uVar1 == this_local._4_4_) {
      this_local._0_4_ = categories.first;
      _rangeDict->fNum = (uint)this_local | _rangeDict->fNum & 0x4000U;
    }
    else if ((int)this_local._4_4_ < (int)uVar1) {
      _rangeDict->fNum = _rangeDict->fNum + -1;
    }
  }
  this->fGroupCount = this->fGroupCount + -1;
  return;
}

Assistant:

void RBBISetBuilder::mergeCategories(IntPair categories) {
    U_ASSERT(categories.first >= 1);
    U_ASSERT(categories.second > categories.first);
    for (RangeDescriptor *rd = fRangeList; rd != nullptr; rd = rd->fNext) {
        int32_t rangeNum = rd->fNum & ~DICT_BIT;
        int32_t rangeDict = rd->fNum & DICT_BIT;
        if (rangeNum == categories.second) {
            rd->fNum = categories.first | rangeDict;
        } else if (rangeNum > categories.second) {
            rd->fNum--;
        }
    }
    --fGroupCount;
}